

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O0

image_u8x3_t * pjpeg_to_u8x3_baseline(pjpeg_t *pj)

{
  byte bVar1;
  pjpeg_component_t *ppVar2;
  pjpeg_component_t *ppVar3;
  pjpeg_component_t *ppVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  image_u8x3_t *piVar17;
  uint8_t b_val_2;
  uint8_t g_val_2;
  uint8_t r_val_2;
  int32_t cr_val_2;
  int32_t cb_val_2;
  int32_t y_val_2;
  int x_2;
  int y_2;
  int32_t b_val_1;
  int32_t g_val_1;
  int32_t r_val_1;
  int32_t y_val_1;
  int x_1;
  int dx;
  int y_1;
  int dy;
  int32_t b0;
  int32_t g0;
  int32_t r0;
  int32_t cr_val_1;
  int32_t cb_val_1;
  int bx;
  int by;
  int32_t b_val;
  int32_t g_val;
  int32_t r_val;
  int32_t cr_val;
  int32_t cb_val;
  int32_t y_val;
  int x;
  int y;
  image_u8x3_t *im;
  int Cr_factor_x;
  int Cr_factor_y;
  int Cb_factor_x;
  int Cb_factor_y;
  pjpeg_component_t *Cr;
  pjpeg_component_t *Cb;
  pjpeg_component_t *Y;
  pjpeg_t *pj_local;
  
  if (pj->ncomponents != 3) {
    __assert_fail("pj->ncomponents == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pjpeg.c"
                  ,0x2e2,"image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *)");
  }
  ppVar2 = pj->components;
  ppVar3 = pj->components;
  ppVar4 = pj->components;
  uVar8 = ppVar2->height / ppVar3[1].height;
  uVar9 = ppVar2->width / ppVar3[1].width;
  uVar10 = ppVar2->height / ppVar4[2].height;
  uVar11 = ppVar2->width / ppVar4[2].width;
  piVar17 = image_u8x3_create(pj->width,pj->height);
  if ((((uVar10 == 1) && (uVar11 == 1)) && (uVar8 == 1)) && (uVar9 == 1)) {
    for (y_val = 0; (uint)y_val < pj->height; y_val = y_val + 1) {
      for (cb_val = 0; (uint)cb_val < pj->width; cb_val = cb_val + 1) {
        iVar14 = (uint)ppVar2->data[y_val * ppVar2->stride + cb_val] * 0x10000;
        iVar12 = ppVar3[1].data[y_val * ppVar3[1].stride + cb_val] - 0x80;
        iVar13 = ppVar4[2].data[y_val * ppVar4[2].stride + cb_val] - 0x80;
        uVar5 = clamp_u8(iVar14 + iVar13 * 0x166e9 >> 0x10);
        piVar17->buf[y_val * piVar17->stride + cb_val * 3] = uVar5;
        uVar5 = clamp_u8(iVar14 + iVar12 * -0x581a + iVar13 * -0xb6d2 >> 0x10);
        piVar17->buf[y_val * piVar17->stride + cb_val * 3 + 1] = uVar5;
        uVar5 = clamp_u8(iVar14 + iVar12 * 0x1c5a2 >> 0x10);
        piVar17->buf[y_val * piVar17->stride + cb_val * 3 + 2] = uVar5;
      }
    }
  }
  else if ((uVar8 == uVar10) && (uVar9 == uVar11)) {
    for (cb_val_1 = 0; (uint)cb_val_1 < pj->height / uVar8; cb_val_1 = cb_val_1 + 1) {
      for (cr_val_1 = 0; (uint)cr_val_1 < pj->width / uVar9; cr_val_1 = cr_val_1 + 1) {
        iVar14 = ppVar3[1].data[cb_val_1 * ppVar3[1].stride + cr_val_1] - 0x80;
        iVar12 = ppVar4[2].data[cb_val_1 * ppVar4[2].stride + cr_val_1] - 0x80;
        for (dx = 0; dx < (int)uVar8; dx = dx + 1) {
          iVar13 = cb_val_1 * uVar8 + dx;
          for (y_val_1 = 0; y_val_1 < (int)uVar9; y_val_1 = y_val_1 + 1) {
            iVar15 = cr_val_1 * uVar9 + y_val_1;
            iVar16 = (uint)ppVar2->data[iVar13 * ppVar2->stride + iVar15] * 0x10000;
            uVar5 = clamp_u8(iVar12 * 0x166e9 + iVar16 >> 0x10);
            piVar17->buf[iVar13 * piVar17->stride + iVar15 * 3] = uVar5;
            uVar5 = clamp_u8(iVar14 * -0x581a + iVar12 * -0xb6d2 + iVar16 >> 0x10);
            piVar17->buf[iVar13 * piVar17->stride + iVar15 * 3 + 1] = uVar5;
            uVar5 = clamp_u8(iVar14 * 0x1c5a2 + iVar16 >> 0x10);
            piVar17->buf[iVar13 * piVar17->stride + iVar15 * 3 + 2] = uVar5;
          }
        }
      }
    }
  }
  else {
    for (y_val_2 = 0; (uint)y_val_2 < pj->height; y_val_2 = y_val_2 + 1) {
      for (cb_val_2 = 0; (uint)cb_val_2 < pj->width; cb_val_2 = cb_val_2 + 1) {
        bVar1 = ppVar2->data[y_val_2 * ppVar2->stride + cb_val_2];
        iVar14 = ppVar3[1].data[(y_val_2 / (int)uVar8) * ppVar3[1].stride + cb_val_2 / (int)uVar9] -
                 0x80;
        iVar12 = ppVar4[2].data[(y_val_2 / (int)uVar10) * ppVar4[2].stride + cb_val_2 / (int)uVar11]
                 - 0x80;
        uVar5 = clampd((double)iVar12 * 1.402 + (double)bVar1);
        uVar6 = clampd((double)iVar12 * -0.71414 + (double)iVar14 * -0.34414 + (double)bVar1);
        uVar7 = clampd((double)iVar14 * 1.772 + (double)bVar1);
        piVar17->buf[y_val_2 * piVar17->stride + cb_val_2 * 3] = uVar5;
        piVar17->buf[y_val_2 * piVar17->stride + cb_val_2 * 3 + 1] = uVar6;
        piVar17->buf[y_val_2 * piVar17->stride + cb_val_2 * 3 + 2] = uVar7;
      }
    }
  }
  return piVar17;
}

Assistant:

image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *pj)
{
    assert(pj->ncomponents == 3);

    pjpeg_component_t *Y = &pj->components[0];
    pjpeg_component_t *Cb = &pj->components[1];
    pjpeg_component_t *Cr = &pj->components[2];

    int Cb_factor_y = Y->height / Cb->height;
    int Cb_factor_x = Y->width / Cb->width;

    int Cr_factor_y = Y->height / Cr->height;
    int Cr_factor_x = Y->width / Cr->width;

    image_u8x3_t *im = image_u8x3_create(pj->width, pj->height);

    if (Cr_factor_y == 1 && Cr_factor_x == 1 && Cb_factor_y == 1 && Cb_factor_x == 1) {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x] * 65536;
                int32_t cb_val = Cb->data[y*Cb->stride + x] - 128;
                int32_t cr_val = Cr->data[y*Cr->stride + x] - 128;

                int32_t r_val = y_val +  91881 * cr_val;
                int32_t g_val = y_val + -22554 * cb_val - 46802 * cr_val;
                int32_t b_val = y_val + 116130 * cb_val;

                im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
            }
        }
    } else if (Cb_factor_y == Cr_factor_y && Cb_factor_x == Cr_factor_x) {
        for (int by = 0; by < pj->height / Cb_factor_y; by++) {
            for (int bx = 0; bx < pj->width / Cb_factor_x; bx++) {

                int32_t cb_val = Cb->data[by*Cb->stride + bx] - 128;
                int32_t cr_val = Cr->data[by*Cr->stride + bx] - 128;

                int32_t r0 =  91881 * cr_val;
                int32_t g0 = -22554 * cb_val - 46802 * cr_val;
                int32_t b0 = 116130 * cb_val;

                for (int dy = 0; dy < Cb_factor_y; dy++) {
                    int y = by*Cb_factor_y + dy;

                    for (int dx = 0; dx < Cb_factor_x; dx++) {
                        int x = bx*Cb_factor_x + dx;

                        int32_t y_val = Y->data[y*Y->stride + x] * 65536;

                        int32_t r_val = r0 + y_val;
                        int32_t g_val = g0 + y_val;
                        int32_t b_val = b0 + y_val;

                        im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                        im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                        im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
                    }
                }
            }
        }
    } else {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x];
                int32_t cb_val = Cb->data[(y / Cb_factor_y)*Cb->stride + (x / Cb_factor_x)] - 128;
                int32_t cr_val = Cr->data[(y / Cr_factor_y)*Cr->stride + (x / Cr_factor_x)] - 128;

                uint8_t r_val = clampd(y_val + 1.402 * cr_val);
                uint8_t g_val = clampd(y_val - 0.34414 * cb_val - 0.71414 * cr_val);
                uint8_t b_val = clampd(y_val + 1.772 * cb_val);

                im->buf[y*im->stride + 3*x + 0 ] = r_val;
                im->buf[y*im->stride + 3*x + 1 ] = g_val;
                im->buf[y*im->stride + 3*x + 2 ] = b_val;
            }
        }
    }

    return im;
}